

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

void If_ManStop(If_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  int local_1c;
  uint local_18;
  int nMemTotal;
  int nUnique;
  int i;
  If_Man_t *p_local;
  
  if ((p->pPars->fVerbose != 0) && (p->vCutData != (Vec_Int_t *)0x0)) {
    If_ManCacheAnalize(p);
  }
  if ((p->pPars->fVerbose != 0) && (p->pPars->fTruth != 0)) {
    local_18 = 0;
    local_1c = 0;
    for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
        nMemTotal = nMemTotal + 1) {
      iVar3 = Vec_MemEntryNum(p->vTtMem[nMemTotal]);
      local_18 = iVar3 + local_18;
    }
    for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
        nMemTotal = nMemTotal + 1) {
      dVar5 = Vec_MemMemory(p->vTtMem[nMemTotal]);
      local_1c = (int)dVar5 + local_1c;
    }
    printf("Unique truth tables = %d   Memory = %.2f MB   ",((double)local_1c * 1.0) / 1048576.0,
           (ulong)local_18);
    Abc_PrintTime(1,"Time",p->timeCache[4]);
    if (p->nCacheMisses != 0) {
      printf("Cache hits = %d. Cache misses = %d  (%.2f %%)\n",
             ((double)p->nCacheMisses * 100.0) / (double)(p->nCacheHits + p->nCacheMisses),
             (ulong)(uint)p->nCacheHits,(ulong)(uint)p->nCacheMisses);
      Abc_PrintTime(1,"Non-DSD   ",p->timeCache[0]);
      Abc_PrintTime(1,"DSD hits  ",p->timeCache[1]);
      Abc_PrintTime(1,"DSD misses",p->timeCache[2]);
      Abc_PrintTime(1,"TOTAL     ",p->timeCache[0] + p->timeCache[1] + p->timeCache[2]);
      Abc_PrintTime(1,"Canon     ",p->timeCache[3]);
    }
  }
  if ((p->pPars->fVerbose != 0) && (p->nCutsUselessAll != 0)) {
    for (nMemTotal = 0; nMemTotal < 0x11; nMemTotal = nMemTotal + 1) {
      if (p->nCutsUseless[nMemTotal] != 0) {
        uVar1 = p->nCutsUseless[nMemTotal];
        uVar2 = p->nCutsCount[nMemTotal];
        iVar3 = p->nCutsUseless[nMemTotal];
        iVar4 = Abc_MaxInt(p->nCutsCount[nMemTotal],1);
        Abc_Print(1,"Useless cuts %2d  = %9d  (out of %9d)  (%6.2f %%)\n",
                  ((double)iVar3 * 100.0) / (double)iVar4,(ulong)(uint)nMemTotal,(ulong)uVar1,
                  (ulong)uVar2);
      }
    }
    uVar1 = p->nCutsUselessAll;
    uVar2 = p->nCutsCountAll;
    iVar3 = p->nCutsUselessAll;
    iVar4 = Abc_MaxInt(p->nCutsCountAll,1);
    Abc_Print(1,"Useless cuts all = %9d  (out of %9d)  (%6.2f %%)\n",
              ((double)iVar3 * 100.0) / (double)iVar4,(ulong)uVar1,(ulong)uVar2);
  }
  if (p->pIfDsdMan != (If_DsdMan_t *)0x0) {
    p->pIfDsdMan = (If_DsdMan_t *)0x0;
  }
  if ((p->pPars->fUseDsd != 0) && ((p->nCountNonDec[0] != 0 || (p->nCountNonDec[1] != 0)))) {
    printf("NonDec0 = %d.  NonDec1 = %d.\n",(ulong)(uint)p->nCountNonDec[0],
           (ulong)(uint)p->nCountNonDec[1]);
  }
  Vec_IntFreeP(&p->vCoAttrs);
  Vec_PtrFree(p->vCis);
  Vec_PtrFree(p->vCos);
  Vec_PtrFree(p->vObjs);
  Vec_PtrFree(p->vTemp);
  Vec_IntFreeP(&p->vCover);
  Vec_IntFreeP(&p->vArray);
  Vec_WrdFreeP(&p->vAnds);
  Vec_WrdFreeP(&p->vAndGate);
  Vec_WrdFreeP(&p->vOrGate);
  Vec_PtrFreeP(&p->vObjsRev);
  Vec_PtrFreeP(&p->vLatchOrder);
  Vec_IntFreeP(&p->vLags);
  Vec_IntFreeP(&p->vDump);
  for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
      nMemTotal = nMemTotal + 1) {
    Vec_IntFreeP(p->vTtDsds + nMemTotal);
  }
  for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
      nMemTotal = nMemTotal + 1) {
    Vec_StrFreeP(p->vTtPerms + nMemTotal);
  }
  for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
      nMemTotal = nMemTotal + 1) {
    Vec_StrFreeP(p->vTtVars + nMemTotal);
  }
  for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
      nMemTotal = nMemTotal + 1) {
    Vec_IntFreeP(p->vTtDecs + nMemTotal);
  }
  Vec_IntFreeP(&p->vCutData);
  Vec_IntFreeP(&p->vPairRes);
  Vec_StrFreeP(&p->vPairPerms);
  Vec_PtrFreeP(&p->vVisited);
  if (p->vPairHash != (Hash_IntMan_t *)0x0) {
    Hash_IntManStop(p->vPairHash);
  }
  for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
      nMemTotal = nMemTotal + 1) {
    Vec_MemHashFree(p->vTtMem[nMemTotal]);
  }
  for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
      nMemTotal = nMemTotal + 1) {
    Vec_MemFreeP(p->vTtMem + nMemTotal);
  }
  for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
      nMemTotal = nMemTotal + 1) {
    Vec_WecFreeP(p->vTtIsops + nMemTotal);
  }
  for (nMemTotal = 6; iVar3 = Abc_MaxInt(6,p->pPars->nLutSize), nMemTotal <= iVar3;
      nMemTotal = nMemTotal + 1) {
    Vec_IntFreeP(p->vTtOccurs + nMemTotal);
  }
  Mem_FixedStop(p->pMemObj,0);
  if (p->vTtMem6 != (Vec_Mem_t *)0x0) {
    Vec_MemHashFree(p->vTtMem6);
    Vec_MemFreeP(&p->vTtMem6);
  }
  if (p->pMemCi != (If_Set_t *)0x0) {
    free(p->pMemCi);
    p->pMemCi = (If_Set_t *)0x0;
  }
  if (p->pMemAnd != (If_Set_t *)0x0) {
    free(p->pMemAnd);
    p->pMemAnd = (If_Set_t *)0x0;
  }
  if (p->puTemp[0] != (uint *)0x0) {
    free(p->puTemp[0]);
    p->puTemp[0] = (uint *)0x0;
  }
  if (p->puTempW != (word *)0x0) {
    free(p->puTempW);
    p->puTempW = (word *)0x0;
  }
  if (p->pPars->pTimesArr != (float *)0x0) {
    free(p->pPars->pTimesArr);
    p->pPars->pTimesArr = (float *)0x0;
  }
  if (p->pPars->pTimesReq != (float *)0x0) {
    free(p->pPars->pTimesReq);
    p->pPars->pTimesReq = (float *)0x0;
  }
  if (p->pManTim != (Tim_Man_t *)0x0) {
    Tim_ManStop(p->pManTim);
  }
  if (p->vSwitching != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vSwitching);
  }
  if (p->pPars->fUseBat != 0) {
    Bat_ManFuncSetdownTable();
  }
  if (p->pHashTable[0] != (void **)0x0) {
    free(p->pHashTable[0]);
    p->pHashTable[0] = (void **)0x0;
  }
  if (p->pHashTable[1] != (void **)0x0) {
    free(p->pHashTable[1]);
    p->pHashTable[1] = (void **)0x0;
  }
  if (p->pMemEntries != (Mem_Fixed_t *)0x0) {
    Mem_FixedStop(p->pMemEntries,0);
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p != (If_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void If_ManStop( If_Man_t * p )
{
    extern void If_ManCacheAnalize( If_Man_t * p );
    int i;
    if ( p->pPars->fVerbose && p->vCutData )
        If_ManCacheAnalize( p );
    if ( p->pPars->fVerbose && p->pPars->fTruth )
    {
        int nUnique = 0, nMemTotal = 0;
        for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
            nUnique += Vec_MemEntryNum(p->vTtMem[i]);
        for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
            nMemTotal += (int)Vec_MemMemory(p->vTtMem[i]);
        printf( "Unique truth tables = %d   Memory = %.2f MB   ", nUnique, 1.0 * nMemTotal / (1<<20) ); 
        Abc_PrintTime( 1, "Time", p->timeCache[4] );
        if ( p->nCacheMisses )
        {
            printf( "Cache hits = %d. Cache misses = %d  (%.2f %%)\n", p->nCacheHits, p->nCacheMisses, 100.0 * p->nCacheMisses / (p->nCacheHits + p->nCacheMisses) ); 
            Abc_PrintTime( 1, "Non-DSD   ", p->timeCache[0] );
            Abc_PrintTime( 1, "DSD hits  ", p->timeCache[1] );
            Abc_PrintTime( 1, "DSD misses", p->timeCache[2] );
            Abc_PrintTime( 1, "TOTAL     ", p->timeCache[0] + p->timeCache[1] + p->timeCache[2] );
            Abc_PrintTime( 1, "Canon     ", p->timeCache[3] );
        }
    }
    if ( p->pPars->fVerbose && p->nCutsUselessAll )
    {
        for ( i = 0; i <= 16; i++ )
            if ( p->nCutsUseless[i] )
                Abc_Print( 1, "Useless cuts %2d  = %9d  (out of %9d)  (%6.2f %%)\n", i, p->nCutsUseless[i], p->nCutsCount[i], 100.0*p->nCutsUseless[i]/Abc_MaxInt(p->nCutsCount[i],1) );
        Abc_Print( 1, "Useless cuts all = %9d  (out of %9d)  (%6.2f %%)\n", p->nCutsUselessAll, p->nCutsCountAll, 100.0*p->nCutsUselessAll/Abc_MaxInt(p->nCutsCountAll,1) );
    }
//    if ( p->pPars->fVerbose && p->nCuts5 )
//        Abc_Print( 1, "Statistics about 5-cuts: Total = %d  Non-decomposable = %d (%.2f %%)\n", p->nCuts5, p->nCuts5-p->nCuts5a, 100.0*(p->nCuts5-p->nCuts5a)/p->nCuts5 );
    if ( p->pIfDsdMan )
        p->pIfDsdMan = NULL;
    if ( p->pPars->fUseDsd && (p->nCountNonDec[0] || p->nCountNonDec[1]) )
        printf( "NonDec0 = %d.  NonDec1 = %d.\n", p->nCountNonDec[0], p->nCountNonDec[1] );
    Vec_IntFreeP( &p->vCoAttrs );
    Vec_PtrFree( p->vCis );
    Vec_PtrFree( p->vCos );
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vTemp );
    Vec_IntFreeP( &p->vCover );
    Vec_IntFreeP( &p->vArray );
    Vec_WrdFreeP( &p->vAnds );
    Vec_WrdFreeP( &p->vAndGate );
    Vec_WrdFreeP( &p->vOrGate );
    Vec_PtrFreeP( &p->vObjsRev );
    Vec_PtrFreeP( &p->vLatchOrder );
    Vec_IntFreeP( &p->vLags );
    Vec_IntFreeP( &p->vDump );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtDsds[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_StrFreeP( &p->vTtPerms[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_StrFreeP( &p->vTtVars[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtDecs[i] );
    Vec_IntFreeP( &p->vCutData );
    Vec_IntFreeP( &p->vPairRes );
    Vec_StrFreeP( &p->vPairPerms );
    Vec_PtrFreeP( &p->vVisited );
    if ( p->vPairHash )
        Hash_IntManStop( p->vPairHash );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_MemHashFree( p->vTtMem[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_MemFreeP( &p->vTtMem[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_WecFreeP( &p->vTtIsops[i] );
    for ( i = 6; i <= Abc_MaxInt(6,p->pPars->nLutSize); i++ )
        Vec_IntFreeP( &p->vTtOccurs[i] );
    Mem_FixedStop( p->pMemObj, 0 );
    if ( p->vTtMem6 )
    {
        Vec_MemHashFree( p->vTtMem6 );
        Vec_MemFreeP( &p->vTtMem6 );
    }
    ABC_FREE( p->pMemCi );
    ABC_FREE( p->pMemAnd );
    ABC_FREE( p->puTemp[0] );
    ABC_FREE( p->puTempW );
    // free pars memory
    ABC_FREE( p->pPars->pTimesArr );
    ABC_FREE( p->pPars->pTimesReq );
    if ( p->pManTim )
        Tim_ManStop( p->pManTim );
    if ( p->vSwitching )
        Vec_IntFree( p->vSwitching );
    if ( p->pPars->fUseBat )
    {
        extern void Bat_ManFuncSetdownTable();
        Bat_ManFuncSetdownTable();
    }
    // hash table
//    if ( p->pPars->fVerbose && p->nTableEntries[0] )
//        printf( "Hash table 2:  Entries = %7d.  Size = %7d.\n", p->nTableEntries[0], p->nTableSize[0] );
//    if ( p->pPars->fVerbose && p->nTableEntries[1] )
//        printf( "Hash table 3:  Entries = %7d.  Size = %7d.\n", p->nTableEntries[1], p->nTableSize[1] );
    ABC_FREE( p->pHashTable[0] );
    ABC_FREE( p->pHashTable[1] );
    if ( p->pMemEntries )
        Mem_FixedStop( p->pMemEntries, 0 );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}